

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O1

const_ret_type __thiscall
dlib::
op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::apply(op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
        *this,long r,long param_2)

{
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar1;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  
  pmVar1 = (this->m->op).
           super_basic_op_mm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
           .m1;
  pmVar2 = (this->m->op).
           super_basic_op_mm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
           .m2;
  lVar6 = (pmVar1->op).stride * r;
  pfVar3 = (pmVar1->op).ptr;
  lVar4 = (pmVar1->op).cols;
  pfVar5 = (pmVar2->op).ptr;
  lVar7 = r * (pmVar2->op).stride;
  fVar9 = pfVar3[lVar6] * pfVar5[lVar7];
  if (1 < lVar4) {
    lVar8 = 1;
    do {
      fVar9 = fVar9 + pfVar3[lVar6 + lVar8] * pfVar5[lVar7 + lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  return fVar9;
}

Assistant:

const_ret_type apply ( long r, long ) const
        { 
            type temp = m(r,0);
            for (long c = 1; c < m.nc(); ++c)
                temp += m(r,c);
            return temp; 
        }